

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VaultClient.h
# Opt level: O0

void __thiscall Vault::HttpClient::~HttpClient(HttpClient *this)

{
  HttpClient *this_local;
  
  *(undefined **)this = &std::locale::facet::typeinfo;
  Catch::clara::std::function<void_(const_Vault::HttpResponse_&)>::~function
            ((function<void_(const_Vault::HttpResponse_&)> *)(this + 0xd8));
  Catch::clara::std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>::
  ~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
             *)(this + 0xb8));
  Config::~Config((Config *)(this + 8));
  return;
}

Assistant:

virtual ~HttpClient() = default;